

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.h
# Opt level: O0

bool __thiscall QLineEditPrivate::shouldShowPlaceholderText(QLineEditPrivate *this)

{
  long lVar1;
  bool bVar2;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetLineControl *in_stack_ffffffffffffff98;
  bool local_59;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar4;
  QLineEditPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QWidgetLineControl::text
            ((QWidgetLineControl *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
  bVar2 = QString::isEmpty((QString *)0x5cc0a0);
  bVar4 = 0;
  bVar3 = 0;
  if (bVar2) {
    QWidgetLineControl::preeditAreaText(in_stack_ffffffffffffff98);
    bVar4 = 1;
    bVar2 = QString::isEmpty((QString *)0x5cc0d9);
    bVar3 = 0;
    if (bVar2) {
      local_59 = false;
      if ((in_RDI->alignment & 4) != 0) {
        q_func(in_RDI);
        local_59 = QWidget::hasFocus((QWidget *)this_00);
      }
      bVar3 = local_59 ^ 0xff;
    }
  }
  if ((bVar4 & 1) != 0) {
    QString::~QString((QString *)0x5cc13e);
  }
  QString::~QString((QString *)0x5cc148);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

inline bool shouldShowPlaceholderText() const
    {
        return control->text().isEmpty() && control->preeditAreaText().isEmpty()
                && !((alignment & Qt::AlignHCenter) && q_func()->hasFocus());
    }